

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

tc_toktyp_t __thiscall CTcTokenizer::next_on_line_xlat_keep(CTcTokenizer *this)

{
  utf8_ptr *p;
  CTcToken *tok;
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  wchar_t wVar6;
  tc_toktyp_t tVar7;
  CVmHashEntry *pCVar8;
  
  p = &this->p_;
  tok = &this->curtok_;
  do {
    skip_ws_and_markers(p);
    wVar6 = utf8_ptr::s_getch(p->p_);
    if (wVar6 < L'R') {
      if (wVar6 == L'>') {
        if ((((this->main_in_embedding_).level != 0) &&
            (((this->main_in_embedding_).s)->parens == 0)) &&
           (wVar6 = utf8_ptr::s_getch_at(p->p_,1), wVar6 == L'>')) goto LAB_0021d31a;
      }
      else {
        if (wVar6 == L'\"') goto LAB_0021d31a;
LAB_0021d1f8:
        if (wVar6 == L'\'') {
LAB_0021d31a:
          tVar7 = xlat_string_to_src(this,&this->main_in_embedding_,0);
          return tVar7;
        }
      }
    }
    else if (wVar6 == L'R') {
      wVar6 = utf8_ptr::s_getch_at(p->p_,1);
      if (wVar6 == L'\"') goto LAB_0021d31a;
      wVar6 = utf8_ptr::s_getch_at(p->p_,1);
      goto LAB_0021d1f8;
    }
    tVar7 = next_on_line(p,tok,&this->main_in_embedding_,0);
    if (tVar7 != TOKT_INVALID) {
      if (tVar7 - TOKT_FLOAT < 2) {
        pcVar3 = (this->curtok_).text_;
        sVar4 = (this->curtok_).text_len_;
        reserve_source(this,sVar4);
        pcVar5 = this->src_ptr_;
        memcpy(pcVar5,pcVar3,sVar4);
        pcVar3 = this->src_ptr_;
        this->src_ptr_ = pcVar3 + sVar4;
        this->src_rem_ = this->src_rem_ - sVar4;
        pcVar3[sVar4] = '\0';
        this->src_ptr_ = this->src_ptr_ + 1;
        this->src_rem_ = this->src_rem_ - 1;
        (this->curtok_).text_ = pcVar5;
      }
      else if (tVar7 == TOKT_SYM) {
        pCVar8 = CVmHashTable::find(this->kw_,(this->curtok_).text_,(this->curtok_).text_len_);
        if (pCVar8 == (CVmHashEntry *)0x0) {
          pcVar3 = (this->curtok_).text_;
          sVar4 = (this->curtok_).text_len_;
          reserve_source(this,sVar4);
          pcVar5 = this->src_ptr_;
          memcpy(pcVar5,pcVar3,sVar4);
          pcVar3 = this->src_ptr_;
          this->src_ptr_ = pcVar3 + sVar4;
          this->src_rem_ = this->src_rem_ - sVar4;
          pcVar3[sVar4] = '\0';
          this->src_ptr_ = this->src_ptr_ + 1;
          this->src_rem_ = this->src_rem_ - 1;
          (this->curtok_).text_ = pcVar5;
          tVar7 = TOKT_SYM;
        }
        else {
          tVar7 = *(tc_toktyp_t *)&pCVar8->field_0x24;
          tok->typ_ = tVar7;
        }
      }
      return tVar7;
    }
    wVar6 = utf8_ptr::s_getch((this->curtok_).text_);
    log_error_or_warning_with_tok(this,TC_SEV_ERROR,(uint)(wVar6 == L'�') * 9 + 0x2745,tok);
    pbVar2 = (byte *)(this->p_).p_;
    bVar1 = *pbVar2;
    (this->p_).p_ =
         (char *)(pbVar2 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
  } while( true );
}

Assistant:

tc_toktyp_t CTcTokenizer::next_on_line_xlat_keep()
{
    tc_toktyp_t typ;

    /* keep going until we find a valid symbol */
    for (;;)
    {
        /* skip whitespace and macro expansion flags */
        skip_ws_and_markers(&p_);
        
        /* see what we have */
        switch(p_.getch())
        {
        case '"':
        case '\'':
            /* it's a string - translate and save it */
            return xlat_string_to_src(&main_in_embedding_, FALSE);

        case '>':
            /* if we're in an embedding, this is the end of it */
            if (main_in_embedding_.in_expr()
                && main_in_embedding_.parens() == 0
                && p_.getch_at(1) == '>')
                return xlat_string_to_src(&main_in_embedding_, FALSE);

            /* use the normal parsing */
            goto do_normal;

        case 'R':
            /* check for a regex string */
            if (p_.getch_at(1) == '"' || p_.getch_at(1) == '\'')
                return xlat_string_to_src(&main_in_embedding_, FALSE);

            /* not a regex string - fall through to the default case */
            
        default:
        do_normal:
            /* for anything else, use the default tokenizer */
            typ = next_on_line(&p_, &curtok_, &main_in_embedding_, FALSE);
            
            /* check the token type */
            switch(typ)
            {
            case TOKT_SYM:
                /* symbol */
                {
                    const char *p;
                    CTcHashEntryKw *kw;
                
                    /* look it up in the keyword table */
                    kw = (CTcHashEntryKw *)kw_->find(curtok_.get_text(),
                        curtok_.get_text_len());
                    if (kw != 0)
                    {
                        /* replace the token with the keyword token type */
                        typ = kw->get_tok_id();
                        curtok_.settyp(typ);
                    }
                    else
                    {
                        /* ordinary symbol - save the text */
                        p = store_source(curtok_.get_text(),
                                         curtok_.get_text_len());
                        
                        /* 
                         *   change the token's text to point to the
                         *   source block, so that this token's text
                         *   pointer will remain permanently valid (the
                         *   original copy, in the source line buffer,
                         *   will be overwritten as soon as we read
                         *   another source line; we don't want the caller
                         *   to have to worry about this, so we return the
                         *   permanent copy) 
                         */
                        curtok_.set_text(p, curtok_.get_text_len());
                    }
                }
                break;

            case TOKT_FLOAT:
            case TOKT_BIGINT:
                /* floating-point number (or promoted large integer) */
                {
                    const char *p;

                    /* 
                     *   save the text so that it remains permanently
                     *   valid - we keep track of floats by the original
                     *   text, and let the code generator produce the
                     *   appropriate object file representation 
                     */
                    p = store_source(curtok_.get_text(),
                                     curtok_.get_text_len());
                    curtok_.set_text(p, curtok_.get_text_len());
                }
                break;

            case TOKT_INVALID:
                /* 
                 *   check for unmappable characters - these will show up as
                 *   Unicode U+FFFD, the "replacement character"; log it as
                 *   'unmappable' if applicable, otherwise as an invalid
                 *   character 
                 */
                if (utf8_ptr::s_getch(curtok_.get_text()) == 0xfffd)
                    log_error_curtok(TCERR_UNMAPPABLE_CHAR);
                else
                    log_error_curtok(TCERR_INVALID_CHAR);

                /* skip this character */
                p_.inc();
                
                /* keep going */
                continue;

            default:
                break;
            }
        }

        /* return the type */
        return typ;
    }
}